

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<unsigned_long,long,long>
          (InternalException *this,string *msg,unsigned_long params,long params_1,long params_2)

{
  long in_R9;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,long,long>
            (&local_30,(Exception *)msg,(string *)params,params_1,params_2,in_R9);
  duckdb::InternalException::InternalException(this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}